

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleShapeEx.cpp
# Opt level: O1

bool __thiscall
cbtPrimitiveTriangle::overlap_test_conservative
          (cbtPrimitiveTriangle *this,cbtPrimitiveTriangle *other)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  
  fVar5 = this->m_margin + other->m_margin;
  cVar1 = (this->m_plane).super_cbtVector3.m_floats[0];
  fVar2 = (this->m_plane).super_cbtVector3.m_floats[1];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * other->m_vertices[0].m_floats[1])),
                           ZEXT416((uint)cVar1),ZEXT416((uint)other->m_vertices[0].m_floats[0]));
  cVar3 = (this->m_plane).super_cbtVector3.m_floats[2];
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)cVar3),
                           ZEXT416((uint)other->m_vertices[0].m_floats[2]));
  fVar4 = (this->m_plane).super_cbtVector3.m_floats[3];
  if (fVar5 < auVar8._0_4_ - fVar4) {
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * other->m_vertices[1].m_floats[1])),
                             ZEXT416((uint)cVar1),ZEXT416((uint)other->m_vertices[1].m_floats[0]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)cVar3),
                             ZEXT416((uint)other->m_vertices[1].m_floats[2]));
    if (fVar5 < auVar8._0_4_ - fVar4) {
      auVar8 = vfmadd132ss_fma(ZEXT416((uint)cVar1),
                               ZEXT416((uint)(fVar2 * other->m_vertices[2].m_floats[1])),
                               ZEXT416((uint)other->m_vertices[2].m_floats[0]));
      auVar8 = vfmadd132ss_fma(ZEXT416((uint)cVar3),auVar8,
                               ZEXT416((uint)other->m_vertices[2].m_floats[2]));
      if (fVar5 < auVar8._0_4_ - fVar4) {
        bVar11 = 0;
        goto LAB_00929d49;
      }
    }
  }
  cVar1 = (other->m_plane).super_cbtVector3.m_floats[0];
  fVar2 = (other->m_plane).super_cbtVector3.m_floats[1];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * this->m_vertices[0].m_floats[1])),
                           ZEXT416((uint)cVar1),ZEXT416((uint)this->m_vertices[0].m_floats[0]));
  cVar3 = (other->m_plane).super_cbtVector3.m_floats[2];
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)cVar3),
                           ZEXT416((uint)this->m_vertices[0].m_floats[2]));
  fVar4 = (other->m_plane).super_cbtVector3.m_floats[3];
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * this->m_vertices[1].m_floats[1])),
                           ZEXT416((uint)cVar1),ZEXT416((uint)this->m_vertices[1].m_floats[0]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)cVar3),
                           ZEXT416((uint)this->m_vertices[1].m_floats[2]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * this->m_vertices[2].m_floats[1])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)this->m_vertices[2].m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)cVar3),
                            ZEXT416((uint)this->m_vertices[2].m_floats[2]));
  uVar6 = vcmpps_avx512vl(ZEXT416((uint)fVar5),ZEXT416((uint)(auVar9._0_4_ - fVar4)),5);
  uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar5),ZEXT416((uint)(auVar8._0_4_ - fVar4)),5);
  bVar11 = auVar10._0_4_ - fVar4 <= fVar5 | (byte)uVar7 | (byte)uVar6;
LAB_00929d49:
  return (bool)(bVar11 & 1);
}

Assistant:

bool cbtPrimitiveTriangle::overlap_test_conservative(const cbtPrimitiveTriangle& other)
{
	cbtScalar total_margin = m_margin + other.m_margin;
	// classify points on other triangle
	cbtScalar dis0 = bt_distance_point_plane(m_plane, other.m_vertices[0]) - total_margin;

	cbtScalar dis1 = bt_distance_point_plane(m_plane, other.m_vertices[1]) - total_margin;

	cbtScalar dis2 = bt_distance_point_plane(m_plane, other.m_vertices[2]) - total_margin;

	if (dis0 > 0.0f && dis1 > 0.0f && dis2 > 0.0f) return false;

	// classify points on this triangle
	dis0 = bt_distance_point_plane(other.m_plane, m_vertices[0]) - total_margin;

	dis1 = bt_distance_point_plane(other.m_plane, m_vertices[1]) - total_margin;

	dis2 = bt_distance_point_plane(other.m_plane, m_vertices[2]) - total_margin;

	if (dis0 > 0.0f && dis1 > 0.0f && dis2 > 0.0f) return false;

	return true;
}